

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O2

void __thiscall
gui::ChatBox::setSizeCharacters(ChatBox *this,Vector2<unsigned_long> *sizeCharacters)

{
  float fVar1;
  float fVar2;
  float fVar3;
  element_type *peVar4;
  ulong uVar5;
  unsigned_long uVar6;
  uint uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  FloatRect FVar8;
  locale local_90 [8];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_68
  ;
  string textBounds;
  
  if (((this->sizeCharacters_).x != sizeCharacters->x) ||
     ((this->sizeCharacters_).y != sizeCharacters->y)) {
    uVar6 = sizeCharacters->y;
    (this->sizeCharacters_).x = sizeCharacters->x;
    (this->sizeCharacters_).y = uVar6;
    textBounds._M_dataplus._M_p = (pointer)&textBounds.field_2;
    std::__cxx11::string::_M_construct((ulong)&textBounds,(char)sizeCharacters->x);
    peVar4 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::locale::locale(local_90);
    sf::String::String((String *)&local_68,&textBounds,local_90);
    sf::Text::setString(&peVar4->text_,(String *)&local_68);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_68);
    std::locale::~locale(local_90);
    FVar8 = sf::Text::getLocalBounds
                      (&((this->style_).
                         super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_);
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = FVar8._0_8_;
    local_88._12_4_ = extraout_XMM0_Dd;
    local_78._8_4_ = in_XMM1_Dc;
    local_78._0_8_ = FVar8._8_8_;
    local_78._12_4_ = in_XMM1_Dd;
    peVar4 = (this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    fVar1 = (peVar4->textPadding_).x;
    fVar2 = (peVar4->textPadding_).y;
    fVar3 = (peVar4->textPadding_).z;
    uVar7 = sf::Text::getCharacterSize(&peVar4->text_);
    uVar5 = sizeCharacters->y;
    (this->size_).x = fVar1 + fVar1 + (float)local_88._0_4_ + (float)local_78._0_4_;
    (this->size_).y = fVar2 + fVar2 + fVar3 * (float)uVar7 * (float)uVar5;
    updateVisibleLines(this,false);
    std::__cxx11::string::~string((string *)&textBounds);
  }
  return;
}

Assistant:

void ChatBox::setSizeCharacters(const sf::Vector2<size_t>& sizeCharacters) {
    if (sizeCharacters_ == sizeCharacters) {
        return;
    }
    sizeCharacters_ = sizeCharacters;

    std::string textBounds(sizeCharacters.x, 'A');
    style_->text_.setString(textBounds);

    const auto bounds = style_->text_.getLocalBounds();
    size_ = sf::Vector2f(
        2.0f * style_->textPadding_.x + bounds.left + bounds.width,
        2.0f * style_->textPadding_.y + style_->textPadding_.z * style_->getCharacterSize() * sizeCharacters.y
    );

    updateVisibleLines();
}